

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewWidget.cpp
# Opt level: O0

void __thiscall KDReports::PreviewWidgetPrivate::setupComboBoxes(PreviewWidgetPrivate *this)

{
  double dVar1;
  QComboBox *pQVar2;
  QVariant local_6d0;
  QString local_6b0;
  QVariant local_698;
  QString local_678;
  QVariant local_660;
  QLatin1Char local_63b;
  QChar local_63a;
  QString local_638;
  QString local_620;
  QVariant local_608;
  QString local_5e8;
  QVariant local_5d0;
  QString local_5b0;
  QVariant local_598;
  QString local_578;
  QVariant local_560;
  QString local_540;
  QVariant local_528;
  QString local_508;
  QVariant local_4f0;
  QString local_4d0;
  QVariant local_4b8;
  QString local_498;
  QVariant local_480;
  QString local_460;
  QVariant local_448;
  QString local_428;
  QVariant local_410;
  QString local_3f0;
  QVariant local_3d8;
  QString local_3b8;
  QVariant local_3a0;
  QString local_380;
  QVariant local_368;
  QString local_348;
  QVariant local_330;
  QString local_310;
  QVariant local_2f8;
  QString local_2d8;
  QVariant local_2c0;
  QString local_2a0;
  QVariant local_288;
  QString local_268;
  QVariant local_250;
  QString local_230;
  QVariant local_218;
  QString local_1f8;
  QVariant local_1e0;
  QString local_1c0;
  QVariant local_1a8;
  QString local_188;
  QVariant local_170;
  QString local_150;
  QVariant local_138;
  QString local_118;
  QVariant local_100;
  QString local_e0;
  QVariant local_c8;
  QString local_a8;
  QVariant local_90;
  QString local_70;
  QVariant local_48;
  QString local_28;
  PreviewWidgetPrivate *local_10;
  PreviewWidgetPrivate *this_local;
  
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  local_10 = this;
  PreviewWidget::tr(&local_28,"A0 (841 x 1189 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_48,3);
  QComboBox::addItem(pQVar2,&local_28,&local_48);
  QVariant::~QVariant(&local_48);
  QString::~QString(&local_28);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_70,"A1 (594 x 841 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_90,4);
  QComboBox::addItem(pQVar2,&local_70,&local_90);
  QVariant::~QVariant(&local_90);
  QString::~QString(&local_70);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_a8,"A2 (420 x 594 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_c8,5);
  QComboBox::addItem(pQVar2,&local_a8,&local_c8);
  QVariant::~QVariant(&local_c8);
  QString::~QString(&local_a8);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_e0,"A3 (297 x 420 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_100,6);
  QComboBox::addItem(pQVar2,&local_e0,&local_100);
  QVariant::~QVariant(&local_100);
  QString::~QString(&local_e0);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_118,"A4 (210 x 297 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_138,7);
  QComboBox::addItem(pQVar2,&local_118,&local_138);
  QVariant::~QVariant(&local_138);
  QString::~QString(&local_118);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_150,"A5 (148 x 210 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_170,8);
  QComboBox::addItem(pQVar2,&local_150,&local_170);
  QVariant::~QVariant(&local_170);
  QString::~QString(&local_150);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_188,"A6 (105 x 148 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_1a8,9);
  QComboBox::addItem(pQVar2,&local_188,&local_1a8);
  QVariant::~QVariant(&local_1a8);
  QString::~QString(&local_188);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_1c0,"A7 (74 x 105 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_1e0,10);
  QComboBox::addItem(pQVar2,&local_1c0,&local_1e0);
  QVariant::~QVariant(&local_1e0);
  QString::~QString(&local_1c0);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_1f8,"A8 (52 x 74 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_218,0xb);
  QComboBox::addItem(pQVar2,&local_1f8,&local_218);
  QVariant::~QVariant(&local_218);
  QString::~QString(&local_1f8);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_230,"B0 (1000 x 1414 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_250,0xe);
  QComboBox::addItem(pQVar2,&local_230,&local_250);
  QVariant::~QVariant(&local_250);
  QString::~QString(&local_230);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_268,"B1 (707 x 1000 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_288,0xf);
  QComboBox::addItem(pQVar2,&local_268,&local_288);
  QVariant::~QVariant(&local_288);
  QString::~QString(&local_268);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_2a0,"B2 (500 x 707 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_2c0,0x10);
  QComboBox::addItem(pQVar2,&local_2a0,&local_2c0);
  QVariant::~QVariant(&local_2c0);
  QString::~QString(&local_2a0);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_2d8,"B3 (353 x 500 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_2f8,0x11);
  QComboBox::addItem(pQVar2,&local_2d8,&local_2f8);
  QVariant::~QVariant(&local_2f8);
  QString::~QString(&local_2d8);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_310,"B4 (250 x 353 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_330,0x12);
  QComboBox::addItem(pQVar2,&local_310,&local_330);
  QVariant::~QVariant(&local_330);
  QString::~QString(&local_310);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_348,"B5 (176 x 250 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_368,0x13);
  QComboBox::addItem(pQVar2,&local_348,&local_368);
  QVariant::~QVariant(&local_368);
  QString::~QString(&local_348);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_380,"B6 (125 x 176 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_3a0,0x14);
  QComboBox::addItem(pQVar2,&local_380,&local_3a0);
  QVariant::~QVariant(&local_3a0);
  QString::~QString(&local_380);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_3b8,"B7 (88 x 125 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_3d8,0x15);
  QComboBox::addItem(pQVar2,&local_3b8,&local_3d8);
  QVariant::~QVariant(&local_3d8);
  QString::~QString(&local_3b8);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_3f0,"B8 (62 x 88 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_410,0x16);
  QComboBox::addItem(pQVar2,&local_3f0,&local_410);
  QVariant::~QVariant(&local_410);
  QString::~QString(&local_3f0);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_428,"C5E (163 x 229 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_448,0x19);
  QComboBox::addItem(pQVar2,&local_428,&local_448);
  QVariant::~QVariant(&local_448);
  QString::~QString(&local_428);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_460,"DLE (110 x 220 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_480,0x1b);
  QComboBox::addItem(pQVar2,&local_460,&local_480);
  QVariant::~QVariant(&local_480);
  QString::~QString(&local_460);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_498,"Executive (7.5 x 10 inches)",(char *)0x0,-1);
  QVariant::QVariant(&local_4b8,2);
  QComboBox::addItem(pQVar2,&local_498,&local_4b8);
  QVariant::~QVariant(&local_4b8);
  QString::~QString(&local_498);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_4d0,"Folio (210 x 330 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_4f0,0x1c);
  QComboBox::addItem(pQVar2,&local_4d0,&local_4f0);
  QVariant::~QVariant(&local_4f0);
  QString::~QString(&local_4d0);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_508,"Ledger (432 x 279 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_528,0x1d);
  QComboBox::addItem(pQVar2,&local_508,&local_528);
  QVariant::~QVariant(&local_528);
  QString::~QString(&local_508);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_540,"Legal (8.5 x 14 inches)",(char *)0x0,-1);
  QVariant::QVariant(&local_560,1);
  QComboBox::addItem(pQVar2,&local_540,&local_560);
  QVariant::~QVariant(&local_560);
  QString::~QString(&local_540);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_578,"Letter (8.5 x 11 inches)",(char *)0x0,-1);
  QVariant::QVariant(&local_598,0);
  QComboBox::addItem(pQVar2,&local_578,&local_598);
  QVariant::~QVariant(&local_598);
  QString::~QString(&local_578);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_5b0,"Tabloid (279 x 432 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_5d0,0x1e);
  QComboBox::addItem(pQVar2,&local_5b0,&local_5d0);
  QVariant::~QVariant(&local_5d0);
  QString::~QString(&local_5b0);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_5e8,"US #10 Envelope (105 x 241 mm)",(char *)0x0,-1);
  QVariant::QVariant(&local_608,0x1a);
  QComboBox::addItem(pQVar2,&local_5e8,&local_608);
  QVariant::~QVariant(&local_608);
  QString::~QString(&local_5e8);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  PreviewWidget::tr(&local_638,"Endless printer (%1 mm wide)",(char *)0x0,-1);
  dVar1 = this->m_endlessPrinterWidth;
  QLatin1Char::QLatin1Char(&local_63b,' ');
  QChar::QChar(&local_63a,local_63b);
  QString::arg(dVar1,(int)&local_620,(char)&local_638,0,(QChar *)0x67);
  QVariant::QVariant(&local_660,0x1f);
  QComboBox::addItem(pQVar2,&local_620,&local_660);
  QVariant::~QVariant(&local_660);
  QString::~QString(&local_620);
  QString::~QString(&local_638);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperOrientationCombo;
  PreviewWidget::tr(&local_678,"Portrait",(char *)0x0,-1);
  QVariant::QVariant(&local_698,0);
  QComboBox::addItem(pQVar2,&local_678,&local_698);
  QVariant::~QVariant(&local_698);
  QString::~QString(&local_678);
  pQVar2 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperOrientationCombo;
  PreviewWidget::tr(&local_6b0,"Landscape",(char *)0x0,-1);
  QVariant::QVariant(&local_6d0,1);
  QComboBox::addItem(pQVar2,&local_6b0,&local_6d0);
  QVariant::~QVariant(&local_6d0);
  QString::~QString(&local_6b0);
  return;
}

Assistant:

void KDReports::PreviewWidgetPrivate::setupComboBoxes()
{
    paperSizeCombo->addItem(PreviewWidget::tr("A0 (841 x 1189 mm)"), QPageSize::A0);
    paperSizeCombo->addItem(PreviewWidget::tr("A1 (594 x 841 mm)"), QPageSize::A1);
    paperSizeCombo->addItem(PreviewWidget::tr("A2 (420 x 594 mm)"), QPageSize::A2);
    paperSizeCombo->addItem(PreviewWidget::tr("A3 (297 x 420 mm)"), QPageSize::A3);
    paperSizeCombo->addItem(PreviewWidget::tr("A4 (210 x 297 mm)"), QPageSize::A4);
    paperSizeCombo->addItem(PreviewWidget::tr("A5 (148 x 210 mm)"), QPageSize::A5);
    paperSizeCombo->addItem(PreviewWidget::tr("A6 (105 x 148 mm)"), QPageSize::A6);
    paperSizeCombo->addItem(PreviewWidget::tr("A7 (74 x 105 mm)"), QPageSize::A7);
    paperSizeCombo->addItem(PreviewWidget::tr("A8 (52 x 74 mm)"), QPageSize::A8);
    // paperSizeCombo->addItem(PreviewWidget::tr("A9 (37 x 52 mm)"), QPageSize::A9);
    paperSizeCombo->addItem(PreviewWidget::tr("B0 (1000 x 1414 mm)"), QPageSize::B0);
    paperSizeCombo->addItem(PreviewWidget::tr("B1 (707 x 1000 mm)"), QPageSize::B1);
    paperSizeCombo->addItem(PreviewWidget::tr("B2 (500 x 707 mm)"), QPageSize::B2);
    paperSizeCombo->addItem(PreviewWidget::tr("B3 (353 x 500 mm)"), QPageSize::B3);
    paperSizeCombo->addItem(PreviewWidget::tr("B4 (250 x 353 mm)"), QPageSize::B4);
    paperSizeCombo->addItem(PreviewWidget::tr("B5 (176 x 250 mm)"), QPageSize::B5);
    paperSizeCombo->addItem(PreviewWidget::tr("B6 (125 x 176 mm)"), QPageSize::B6);
    paperSizeCombo->addItem(PreviewWidget::tr("B7 (88 x 125 mm)"), QPageSize::B7);
    paperSizeCombo->addItem(PreviewWidget::tr("B8 (62 x 88 mm)"), QPageSize::B8);
    // paperSizeCombo->addItem(PreviewWidget::tr("B9 (44 x 62 mm)"), QPageSize::B9);
    // paperSizeCombo->addItem(PreviewWidget::tr("B10 (31 x 44 mm)"), QPageSize::B10);
    paperSizeCombo->addItem(PreviewWidget::tr("C5E (163 x 229 mm)"), QPageSize::C5E);
    paperSizeCombo->addItem(PreviewWidget::tr("DLE (110 x 220 mm)"), QPageSize::DLE);
    paperSizeCombo->addItem(PreviewWidget::tr("Executive (7.5 x 10 inches)"), QPageSize::Executive);
    paperSizeCombo->addItem(PreviewWidget::tr("Folio (210 x 330 mm)"), QPageSize::Folio);
    paperSizeCombo->addItem(PreviewWidget::tr("Ledger (432 x 279 mm)"), QPageSize::Ledger);
    paperSizeCombo->addItem(PreviewWidget::tr("Legal (8.5 x 14 inches)"), QPageSize::Legal);
    paperSizeCombo->addItem(PreviewWidget::tr("Letter (8.5 x 11 inches)"), QPageSize::Letter);
    paperSizeCombo->addItem(PreviewWidget::tr("Tabloid (279 x 432 mm)"), QPageSize::Tabloid);
    paperSizeCombo->addItem(PreviewWidget::tr("US #10 Envelope (105 x 241 mm)"), QPageSize::Comm10E);
    paperSizeCombo->addItem(PreviewWidget::tr("Endless printer (%1 mm wide)").arg(m_endlessPrinterWidth), QPageSize::Custom);

    paperOrientationCombo->addItem(PreviewWidget::tr("Portrait"), QPageLayout::Portrait);
    paperOrientationCombo->addItem(PreviewWidget::tr("Landscape"), QPageLayout::Landscape);
}